

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O2

int ecdsa_sig_to_fixed(EC_KEY *key,uint8_t *out,size_t *out_len,size_t max_out,ECDSA_SIG *sig)

{
  int line;
  uint uVar1;
  int iVar2;
  EC_GROUP *group;
  BIGNUM *bn;
  int reason;
  ulong len;
  
  group = (EC_GROUP *)EC_KEY_get0_group((EC_KEY *)key);
  if (group == (EC_GROUP *)0x0) {
    iVar2 = 0x1a;
    reason = 0x43;
    line = 0x38;
  }
  else {
    bn = EC_GROUP_get0_order(group);
    uVar1 = BN_num_bytes(bn);
    if (uVar1 < 0x43) {
      iVar2 = BN_is_negative(*(BIGNUM **)max_out);
      if (iVar2 == 0) {
        len = (ulong)uVar1;
        iVar2 = BN_bn2bin_padded(out,len,*(BIGNUM **)max_out);
        if (((iVar2 != 0) && (iVar2 = BN_is_negative(*(BIGNUM **)(max_out + 8)), iVar2 == 0)) &&
           (iVar2 = BN_bn2bin_padded(out + len,len,*(BIGNUM **)(max_out + 8)), iVar2 != 0)) {
          *out_len = len * 2;
          return 1;
        }
      }
      iVar2 = 0x1a;
      reason = 100;
      line = 0x43;
    }
    else {
      iVar2 = 0xf;
      reason = 100;
      line = 0x3d;
    }
  }
  ERR_put_error(iVar2,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                ,line);
  return 0;
}

Assistant:

static int ecdsa_sig_to_fixed(const EC_KEY *key, uint8_t *out, size_t *out_len,
                              size_t max_out, const ECDSA_SIG *sig) {
  const EC_GROUP *group = EC_KEY_get0_group(key);
  if (group == NULL) {
    OPENSSL_PUT_ERROR(ECDSA, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  if (max_out < 2 * scalar_len) {
    OPENSSL_PUT_ERROR(EC, EC_R_BUFFER_TOO_SMALL);
    return 0;
  }
  if (BN_is_negative(sig->r) || !BN_bn2bin_padded(out, scalar_len, sig->r) ||
      BN_is_negative(sig->s) ||
      !BN_bn2bin_padded(out + scalar_len, scalar_len, sig->s)) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    return 0;
  }
  *out_len = 2 * scalar_len;
  return 1;
}